

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

UBool __thiscall icu_63::UnifiedCache::_isEvictable(UnifiedCache *this,UHashElement *element)

{
  void *pvVar1;
  SharedObject *theValue_00;
  UBool UVar2;
  bool local_32;
  bool local_31;
  SharedObject *theValue;
  CacheKeyBase *theKey;
  UHashElement *element_local;
  UnifiedCache *this_local;
  
  pvVar1 = (element->key).pointer;
  theValue_00 = (SharedObject *)(element->value).pointer;
  UVar2 = _inProgress(this,theValue_00,*(UErrorCode *)((long)pvVar1 + 8));
  if (UVar2 == '\0') {
    local_31 = true;
    if (*(char *)((long)pvVar1 + 0xc) != '\0') {
      local_32 = false;
      if (theValue_00->softRefCount == 1) {
        UVar2 = SharedObject::noHardReferences(theValue_00);
        local_32 = UVar2 != '\0';
      }
      local_31 = local_32;
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool UnifiedCache::_isEvictable(const UHashElement *element) const
{
    const CacheKeyBase *theKey = (const CacheKeyBase *) element->key.pointer;
    const SharedObject *theValue =
            (const SharedObject *) element->value.pointer;

    // Entries that are under construction are never evictable
    if (_inProgress(theValue, theKey->fCreationStatus)) {
        return FALSE;
    }

    // We can evict entries that are either not a master or have just
    // one reference (The one reference being from the cache itself).
    return (!theKey->fIsMaster || (theValue->softRefCount == 1 && theValue->noHardReferences()));
}